

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.cc
# Opt level: O0

int __thiscall
dynet::SimpleRNNBuilder::copy(SimpleRNNBuilder *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  size_type sVar1;
  size_type sVar2;
  invalid_argument *this_00;
  const_reference pvVar3;
  const_reference pvVar4;
  reference pvVar5;
  reference pvVar6;
  size_t i;
  ostringstream oss;
  SimpleRNNBuilder *rnn_simple;
  ulong local_1d0;
  string local_1c0 [48];
  ostringstream local_190 [376];
  EVP_PKEY_CTX *local_18;
  EVP_PKEY_CTX *local_10;
  SimpleRNNBuilder *local_8;
  
  local_18 = dst;
  local_10 = dst;
  local_8 = this;
  sVar1 = std::
          vector<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>,_std::allocator<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>_>_>
          ::size(&this->params);
  sVar2 = std::
          vector<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>,_std::allocator<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>_>_>
          ::size((vector<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>,_std::allocator<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>_>_>
                  *)(local_18 + 0x30));
  if (sVar1 != sVar2) {
    std::__cxx11::ostringstream::ostringstream(local_190);
    std::operator<<((ostream *)local_190,
                    "Attempt to copy between two SimpleRNNBuilders that are not the same size");
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::invalid_argument::invalid_argument(this_00,local_1c0);
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  local_1d0 = 0;
  while( true ) {
    sVar1 = std::
            vector<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>,_std::allocator<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>_>_>
            ::size((vector<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>,_std::allocator<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>_>_>
                    *)(local_18 + 0x30));
    if (sVar1 <= local_1d0) break;
    pvVar3 = std::
             vector<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>,_std::allocator<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>_>_>
             ::operator[]((vector<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>,_std::allocator<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>_>_>
                           *)(local_18 + 0x30),local_1d0);
    pvVar4 = std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>::operator[](pvVar3,0);
    pvVar5 = std::
             vector<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>,_std::allocator<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>_>_>
             ::operator[](&this->params,local_1d0);
    pvVar6 = std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>::operator[](pvVar5,0);
    pvVar6->p = pvVar4->p;
    pvVar3 = std::
             vector<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>,_std::allocator<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>_>_>
             ::operator[]((vector<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>,_std::allocator<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>_>_>
                           *)(local_18 + 0x30),local_1d0);
    pvVar4 = std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>::operator[](pvVar3,1);
    pvVar5 = std::
             vector<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>,_std::allocator<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>_>_>
             ::operator[](&this->params,local_1d0);
    pvVar6 = std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>::operator[](pvVar5,1);
    pvVar6->p = pvVar4->p;
    pvVar3 = std::
             vector<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>,_std::allocator<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>_>_>
             ::operator[]((vector<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>,_std::allocator<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>_>_>
                           *)(local_18 + 0x30),local_1d0);
    pvVar4 = std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>::operator[](pvVar3,2);
    pvVar5 = std::
             vector<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>,_std::allocator<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>_>_>
             ::operator[](&this->params,local_1d0);
    pvVar6 = std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>::operator[](pvVar5,2);
    pvVar6->p = pvVar4->p;
    local_1d0 = local_1d0 + 1;
  }
  return (int)local_1d0;
}

Assistant:

void SimpleRNNBuilder::copy(const RNNBuilder & rnn) {
  const SimpleRNNBuilder & rnn_simple = (const SimpleRNNBuilder&)rnn;
  DYNET_ARG_CHECK(params.size() == rnn_simple.params.size(),
                          "Attempt to copy between two SimpleRNNBuilders that are not the same size");
  for(size_t i = 0; i < rnn_simple.params.size(); ++i) {
    params[i][0] = rnn_simple.params[i][0];
    params[i][1] = rnn_simple.params[i][1];
    params[i][2] = rnn_simple.params[i][2];
  }
}